

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O1

pair<duckdb::AggregateFunction,_bool> * __thiscall
duckdb::FunctionSerializer::
DeserializeBase<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
          (pair<duckdb::AggregateFunction,_bool> *__return_storage_ptr__,FunctionSerializer *this,
          Deserializer *deserializer,CatalogType catalog_type)

{
  undefined1 uVar1;
  ClientContext *this_00;
  bool has_serialize;
  vector<duckdb::LogicalType,_true> original_arguments;
  vector<duckdb::LogicalType,_true> arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  AggregateFunction function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe08;
  bool local_1e9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c8;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  undefined1 local_168 [24];
  AggregateFunction local_150;
  
  this_00 = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)this);
  (**(code **)(*(long *)this + 0x10))(this,500,"name");
  (**(code **)(*(long *)this + 0xd0))(local_1a8,this);
  (**(code **)(*(long *)this + 0x18))(this);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_1c8,(Deserializer *)this,0x1f5,"arguments")
  ;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_1e8,(Deserializer *)this,0x1f6,
             "original_arguments");
  local_168._0_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168._8_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168._16_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeserializeFunction<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
            (&local_150,(FunctionSerializer *)this_00,(ClientContext *)((ulong)deserializer & 0xff),
             (CatalogType)local_1a8,(string *)local_168,
             (vector<duckdb::LogicalType,_true> *)&local_188,in_stack_fffffffffffffe08);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_168);
  (**(code **)(*(long *)this + 0x10))(this,0x1f7,"has_serialize");
  uVar1 = (**(code **)(*(long *)this + 0x60))(this);
  (**(code **)(*(long *)this + 0x18))(this);
  local_1e9 = (bool)uVar1;
  ::std::pair<duckdb::AggregateFunction,_bool>::pair<duckdb::AggregateFunction,_bool_&,_true>
            (__return_storage_ptr__,&local_150,&local_1e9);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02476990;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1c8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static pair<FUNC, bool> DeserializeBase(Deserializer &deserializer, CatalogType catalog_type) {
		auto &context = deserializer.Get<ClientContext &>();
		auto name = deserializer.ReadProperty<string>(500, "name");
		auto arguments = deserializer.ReadProperty<vector<LogicalType>>(501, "arguments");
		auto original_arguments = deserializer.ReadProperty<vector<LogicalType>>(502, "original_arguments");
		auto function = DeserializeFunction<FUNC, CATALOG_ENTRY>(context, catalog_type, name, std::move(arguments),
		                                                         std::move(original_arguments));
		auto has_serialize = deserializer.ReadProperty<bool>(503, "has_serialize");
		return make_pair(std::move(function), has_serialize);
	}